

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Scl_LibPinArrival(SC_Timing *pTime,SC_Pair *pArrIn,SC_Pair *pSlewIn,SC_Pair *pLoad,
                      SC_Pair *pArrOut,SC_Pair *pSlewOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  SC_Pair *pSlewOut_local;
  SC_Pair *pArrOut_local;
  SC_Pair *pLoad_local;
  SC_Pair *pSlewIn_local;
  SC_Pair *pArrIn_local;
  SC_Timing *pTime_local;
  
  if ((pTime->tsense == sc_ts_Pos) || (pTime->tsense == sc_ts_Non)) {
    fVar2 = pArrOut->rise;
    fVar3 = pArrIn->rise;
    fVar1 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->rise,pLoad->rise);
    fVar2 = Abc_MaxFloat(fVar2,fVar3 + fVar1);
    pArrOut->rise = fVar2;
    fVar2 = pArrOut->fall;
    fVar3 = pArrIn->fall;
    fVar1 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->fall,pLoad->fall);
    fVar2 = Abc_MaxFloat(fVar2,fVar3 + fVar1);
    pArrOut->fall = fVar2;
    fVar2 = pSlewOut->rise;
    fVar3 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->rise,pLoad->rise);
    fVar2 = Abc_MaxFloat(fVar2,fVar3);
    pSlewOut->rise = fVar2;
    fVar2 = pSlewOut->fall;
    fVar3 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->fall,pLoad->fall);
    fVar2 = Abc_MaxFloat(fVar2,fVar3);
    pSlewOut->fall = fVar2;
  }
  if ((pTime->tsense == sc_ts_Neg) || (pTime->tsense == sc_ts_Non)) {
    fVar2 = pArrOut->rise;
    fVar3 = pArrIn->fall;
    fVar1 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->fall,pLoad->rise);
    fVar2 = Abc_MaxFloat(fVar2,fVar3 + fVar1);
    pArrOut->rise = fVar2;
    fVar2 = pArrOut->fall;
    fVar3 = pArrIn->rise;
    fVar1 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->rise,pLoad->fall);
    fVar2 = Abc_MaxFloat(fVar2,fVar3 + fVar1);
    pArrOut->fall = fVar2;
    fVar2 = pSlewOut->rise;
    fVar3 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->fall,pLoad->rise);
    fVar2 = Abc_MaxFloat(fVar2,fVar3);
    pSlewOut->rise = fVar2;
    fVar2 = pSlewOut->fall;
    fVar3 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->rise,pLoad->fall);
    fVar2 = Abc_MaxFloat(fVar2,fVar3);
    pSlewOut->fall = fVar2;
  }
  return;
}

Assistant:

static inline void Scl_LibPinArrival( SC_Timing * pTime, SC_Pair * pArrIn, SC_Pair * pSlewIn, SC_Pair * pLoad, SC_Pair * pArrOut, SC_Pair * pSlewOut )
{
    if (pTime->tsense == sc_ts_Pos || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->rise + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->rise, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->fall + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->fall, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->rise, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->fall, pLoad->fall) );
    }
    if (pTime->tsense == sc_ts_Neg || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->fall + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->fall, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->rise + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->rise, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->fall, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->rise, pLoad->fall) );
    }
}